

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::InsertLoads(LinearScan *this,StackSym *sym,RegNum reg)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  Type *ppIVar5;
  Iterator local_48;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *local_38;
  
  local_48.list =
       (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)((long)sym->scratch + 0x30);
  local_48.current = (NodeBase *)local_48.list;
  local_38 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_48.list;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pSVar4 = local_38;
  while( true ) {
    if (pSVar4 == (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pSVar4 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    }
    pSVar4 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
             (pSVar4->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (pSVar4 == (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_48.list) break;
    local_48.current = (NodeBase *)pSVar4;
    ppIVar5 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    InsertLoad(this,*ppIVar5,sym,reg);
    pSVar4 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
  }
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(local_38);
  return;
}

Assistant:

void
LinearScan::InsertLoads(StackSym *sym, RegNum reg)
{
    Lifetime *lifetime = sym->scratch.linearScan.lifetime;

    FOREACH_SLIST_ENTRY(IR::Instr *, instr, &lifetime->useList)
    {
        this->InsertLoad(instr, sym, reg);
    } NEXT_SLIST_ENTRY;

    lifetime->useList.Clear();
}